

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  undefined8 uVar1;
  
  uVar1 = __cxa_rethrow();
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

virtual std::string translateActiveException() const {
            try {
#ifdef __OBJC__
                // In Objective-C try objective-c exceptions first
                @try {
                    throw;
                }
                @catch (NSException *exception) {
                    return toString( [exception description] );
                }
#else
                throw;
#endif
            }
            catch( TestFailureException& ) {
                throw;
            }
            catch( std::exception& ex ) {
                return ex.what();
            }
            catch( std::string& msg ) {
                return msg;
            }
            catch( const char* msg ) {
                return msg;
            }
            catch(...) {
                return tryTranslators( m_translators.begin() );
            }
        }